

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_connect(connectdata *conn,_Bool *done)

{
  char *pcVar1;
  SASL *sasl;
  char cVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  size_t len;
  char *pcVar6;
  char *first;
  char *value;
  
  *done = false;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 120000;
  (conn->proto).ftpc.pp.statemach_act = imap_statemach_act;
  (conn->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  (conn->proto).imapc.preftype = 0xffffffff;
  sasl = &(conn->proto).imapc.sasl;
  Curl_sasl_init(sasl,&saslimap);
  Curl_dyn_init(&(conn->proto).imapc.dyn,0x10000);
  Curl_pp_setup(&(conn->proto).ftpc.pp);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  (conn->proto).ftpc.dont_check = true;
  if (first == (char *)0x0) {
LAB_001293fe:
    CVar4 = CURLE_OK;
  }
  else {
    do {
      cVar2 = *first;
      pcVar6 = first;
      if (cVar2 == '\0') goto LAB_001293fe;
      while ((value = pcVar6 + 1, cVar2 != '\0' && (cVar2 != '='))) {
        pcVar6 = value;
        cVar2 = *value;
      }
      len = 0xffffffffffffffff;
      while ((cVar2 != '\0' && (cVar2 != ';'))) {
        pcVar1 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
        len = len + 1;
        cVar2 = *pcVar1;
      }
      iVar3 = Curl_strncasecompare(first,"AUTH=",5);
      if (iVar3 == 0) {
        CVar4 = CURLE_URL_MALFORMAT;
        break;
      }
      CVar4 = Curl_sasl_parse_url_auth_option(sasl,value,len);
      first = pcVar6 + (*pcVar6 == ';');
    } while (CVar4 == CURLE_OK);
  }
  iVar3 = *(int *)((long)&conn->proto + 0xa8);
  uVar5 = (uint)(iVar3 != -0x21) * 3 - 1;
  if (iVar3 == 0) {
    uVar5 = 0;
  }
  (conn->proto).imapc.preftype = uVar5;
  if (CVar4 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_SERVERGREET;
    *(undefined2 *)((long)&conn->proto + 0xc0) = 0x2a;
    CVar4 = imap_multi_statemach(conn,done);
    return CVar4;
  }
  return CVar4;
}

Assistant:

static CURLcode imap_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = imap_statemach_act;
  pp->endofresp = imap_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, &saslimap);

  Curl_dyn_init(&imapc->dyn, DYN_IMAP_CMD);
  /* Initialise the pingpong layer */
  Curl_pp_setup(pp);
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(conn, done);

  return result;
}